

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

UniValue * __thiscall
RPCResult::MatchesType(UniValue *__return_storage_ptr__,RPCResult *this,UniValue *result)

{
  string *__k;
  long lVar1;
  pointer pRVar2;
  RPCResult *pRVar3;
  string_view func;
  string str;
  string key;
  string str_00;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  bool bVar4;
  UniValue *pUVar5;
  ulong uVar6;
  const_reference pvVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  iterator iVar9;
  _Base_ptr p_Var10;
  iterator iVar11;
  NonFatalCheckError *this_00;
  VType t;
  pointer pRVar12;
  RPCResult *this_01;
  char **in_R8;
  ulong uVar13;
  long lVar14;
  long in_FS_OFFSET;
  string_view file;
  string_view msg;
  undefined8 in_stack_fffffffffffffbf8;
  undefined8 in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc18;
  undefined1 auVar15 [32];
  undefined1 in_stack_fffffffffffffc20 [80];
  string local_388 [32];
  UniValue local_368;
  string local_310 [32];
  UniValue local_2f0;
  string local_298 [32];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  result_obj;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  doc_keys;
  UniValue local_218;
  string local_1c0 [32];
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [16];
  UniValue local_180;
  string local_128;
  UniValue match;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  UniValue errors;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_skip_type_check == true) {
switchD_005a4ee4_caseD_6:
LAB_005a4ebb:
    errors.typ._0_1_ = 1;
    UniValue::UniValue<bool,_bool,_true>(__return_storage_ptr__,(bool *)&errors);
    pUVar5 = __return_storage_ptr__;
  }
  else {
    t = VNULL;
    switch(this->m_type) {
    case OBJ:
    case OBJ_DYN:
      t = VOBJ;
      break;
    case ARR:
    case ARR_FIXED:
      t = VARR;
      break;
    case STR:
    case STR_HEX:
      t = VSTR;
      break;
    case NUM:
    case STR_AMOUNT:
    case NUM_TIME:
      t = VNUM;
      break;
    case BOOL:
      t = VBOOL;
      break;
    case NONE:
      break;
    case ANY:
    case ELISION:
      goto switchD_005a4ee4_caseD_6;
    default:
      this_00 = (NonFatalCheckError *)__cxa_allocate_exception(0x10);
      errors.typ = 0xc;
      errors._4_4_ = 0;
      errors.val._M_dataplus._M_p = "ExpectedType";
      func._M_str = "ExpectedType";
      func._M_len = 0xc;
      file._M_str = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/util.cpp"
      ;
      file._M_len = 0x5c;
      msg._M_str = "Unreachable code reached (non-fatal)";
      msg._M_len = 0x24;
      NonFatalCheckError::NonFatalCheckError(this_00,msg,file,0x46d,func);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(this_00,&NonFatalCheckError::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_005a5780;
    }
    if (t == result->typ) {
      if (t == VOBJ) {
        if (((this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
             super__Vector_impl_data._M_start !=
             (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
             super__Vector_impl_data._M_finish) &&
           (pvVar7 = std::vector<RPCResult,_std::allocator<RPCResult>_>::at(&this->m_inner,0),
           pvVar7->m_type == ELISION)) goto LAB_005a50d6;
        local_1a0 = local_190;
        local_198 = 0;
        local_190[0] = 0;
        str_00._M_string_length = in_stack_fffffffffffffc00;
        str_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbf8;
        str_00.field_2._M_allocated_capacity = in_stack_fffffffffffffc08;
        str_00.field_2._8_8_ = __return_storage_ptr__;
        UniValue::UniValue(&errors,VOBJ,str_00);
        std::__cxx11::string::~string((string *)&local_1a0);
        if (this->m_type == OBJ_DYN) {
          pvVar7 = std::vector<RPCResult,_std::allocator<RPCResult>_>::at(&this->m_inner,0);
          lVar14 = 0;
          for (uVar13 = 0; pUVar5 = UniValue::get_obj(result),
              uVar13 < (ulong)(((long)(pUVar5->values).
                                      super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)(pUVar5->values).
                                     super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                                     .super__Vector_impl_data._M_start) / 0x58); uVar13 = uVar13 + 1
              ) {
            pUVar5 = UniValue::get_obj(result);
            pUVar5 = UniValue::operator[](pUVar5,uVar13);
            MatchesType(&match,pvVar7,pUVar5);
            bVar4 = UniValue::isTrue(&match);
            if (!bVar4) {
              pvVar8 = UniValue::getKeys_abi_cxx11_(result);
              std::__cxx11::string::string
                        (local_1c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&(((pvVar8->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar14));
              UniValue::UniValue(&local_218,&match);
              key_00._M_string_length = in_stack_fffffffffffffc00;
              key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbf8;
              key_00.field_2._M_allocated_capacity = in_stack_fffffffffffffc08;
              key_00.field_2._8_8_ = __return_storage_ptr__;
              auVar15 = in_stack_fffffffffffffc20._0_32_;
              val_00.val._M_dataplus._M_p = (pointer)auVar15._0_8_;
              val_00.val._M_string_length = auVar15._8_8_;
              val_00.val.field_2 =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    )auVar15._16_16_;
              val_00.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data =
                   (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )in_stack_fffffffffffffc20._32_24_;
              val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data =
                   (_Vector_base<UniValue,_std::allocator<UniValue>_>)
                   (_Vector_base<UniValue,_std::allocator<UniValue>_>)
                   in_stack_fffffffffffffc20._56_24_;
              val_00._0_8_ = uVar13;
              UniValue::pushKV(&errors,key_00,val_00);
              UniValue::~UniValue(&local_218);
              std::__cxx11::string::~string(local_1c0);
            }
            UniValue::~UniValue(&match);
            lVar14 = lVar14 + 0x20;
          }
          if (errors.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              errors.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start) goto LAB_005a547f;
          match.typ._0_1_ = 1;
          UniValue::UniValue<bool,_bool,_true>(__return_storage_ptr__,(bool *)&match);
        }
        else {
          doc_keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &doc_keys._M_t._M_impl.super__Rb_tree_header._M_header;
          doc_keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          doc_keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          doc_keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          pRVar2 = (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                   .super__Vector_impl_data._M_finish;
          doc_keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               doc_keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          for (pRVar12 = (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                         _M_impl.super__Vector_impl_data._M_start; pRVar12 != pRVar2;
              pRVar12 = pRVar12 + 1) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&doc_keys,&pRVar12->m_key_name);
          }
          result_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &result_obj._M_t._M_impl.super__Rb_tree_header._M_header;
          result_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          result_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          result_obj._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          result_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               result_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          UniValue::getObjMap(result,&result_obj);
          for (p_Var10 = result_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var10 != &result_obj._M_t._M_impl.super__Rb_tree_header;
              p_Var10 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10)) {
            iVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(&doc_keys._M_t,(key_type *)(p_Var10 + 1));
            if ((_Rb_tree_header *)iVar9._M_node == &doc_keys._M_t._M_impl.super__Rb_tree_header) {
              std::__cxx11::string::string
                        (local_298,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var10 + 1));
              UniValue::UniValue<const_char_(&)[33],_char[33],_true>
                        (&local_2f0,(char (*) [33])"key returned that was not in doc");
              key_01._M_string_length = in_stack_fffffffffffffc00;
              key_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbf8;
              key_01.field_2._M_allocated_capacity = in_stack_fffffffffffffc08;
              key_01.field_2._8_8_ = __return_storage_ptr__;
              auVar15 = in_stack_fffffffffffffc20._0_32_;
              val_01.val._M_dataplus._M_p = (pointer)auVar15._0_8_;
              val_01.val._M_string_length = auVar15._8_8_;
              val_01.val.field_2 =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    )auVar15._16_16_;
              val_01.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data =
                   (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )in_stack_fffffffffffffc20._32_24_;
              val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data =
                   (_Vector_base<UniValue,_std::allocator<UniValue>_>)
                   (_Vector_base<UniValue,_std::allocator<UniValue>_>)
                   in_stack_fffffffffffffc20._56_24_;
              val_01._0_8_ = in_stack_fffffffffffffc18;
              UniValue::pushKV(&errors,key_01,val_01);
              UniValue::~UniValue(&local_2f0);
              std::__cxx11::string::~string(local_298);
            }
          }
          pRVar3 = (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                   .super__Vector_impl_data._M_finish;
          for (this_01 = (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                         _M_impl.super__Vector_impl_data._M_start; this_01 != pRVar3;
              this_01 = this_01 + 1) {
            __k = &this_01->m_key_name;
            iVar11 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                     ::find(&result_obj._M_t,__k);
            if ((_Rb_tree_header *)iVar11._M_node == &result_obj._M_t._M_impl.super__Rb_tree_header)
            {
              if (this_01->m_optional == false) {
                std::__cxx11::string::string(local_310,__k);
                UniValue::UniValue<const_char_(&)[47],_char[47],_true>
                          (&local_368,
                           (char (*) [47])"key missing, despite not being optional in doc");
                key_03._M_string_length = in_stack_fffffffffffffc00;
                key_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbf8;
                key_03.field_2._M_allocated_capacity = in_stack_fffffffffffffc08;
                key_03.field_2._8_8_ = __return_storage_ptr__;
                auVar15 = in_stack_fffffffffffffc20._0_32_;
                val_03.val._M_dataplus._M_p = (pointer)auVar15._0_8_;
                val_03.val._M_string_length = auVar15._8_8_;
                val_03.val.field_2 =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      )auVar15._16_16_;
                val_03.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data =
                     (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )in_stack_fffffffffffffc20._32_24_;
                val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data =
                     (_Vector_base<UniValue,_std::allocator<UniValue>_>)
                     (_Vector_base<UniValue,_std::allocator<UniValue>_>)
                     in_stack_fffffffffffffc20._56_24_;
                val_03._0_8_ = in_stack_fffffffffffffc18;
                UniValue::pushKV(&errors,key_03,val_03);
                UniValue::~UniValue(&local_368);
                std::__cxx11::string::~string(local_310);
              }
            }
            else {
              MatchesType(&match,this_01,(UniValue *)(iVar11._M_node + 2));
              bVar4 = UniValue::isTrue(&match);
              if (!bVar4) {
                std::__cxx11::string::string(local_388,__k);
                UniValue::UniValue((UniValue *)&stack0xfffffffffffffc20,&match);
                key_02._M_string_length = in_stack_fffffffffffffc00;
                key_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbf8;
                key_02.field_2._M_allocated_capacity = in_stack_fffffffffffffc08;
                key_02.field_2._8_8_ = __return_storage_ptr__;
                auVar15 = in_stack_fffffffffffffc20._0_32_;
                val_02.val._M_dataplus._M_p = (pointer)auVar15._0_8_;
                val_02.val._M_string_length = auVar15._8_8_;
                val_02.val.field_2 =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      )auVar15._16_16_;
                val_02.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data =
                     (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )in_stack_fffffffffffffc20._32_24_;
                val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data =
                     (_Vector_base<UniValue,_std::allocator<UniValue>_>)
                     (_Vector_base<UniValue,_std::allocator<UniValue>_>)
                     in_stack_fffffffffffffc20._56_24_;
                val_02._0_8_ = in_stack_fffffffffffffc18;
                UniValue::pushKV(&errors,key_02,val_02);
                UniValue::~UniValue((UniValue *)&stack0xfffffffffffffc20);
                std::__cxx11::string::~string(local_388);
              }
              UniValue::~UniValue(&match);
            }
          }
          if (errors.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              errors.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start) {
            match.typ._0_1_ = 1;
            UniValue::UniValue<bool,_bool,_true>(__return_storage_ptr__,(bool *)&match);
          }
          else {
            UniValue::UniValue(__return_storage_ptr__,&errors);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
          ::~_Rb_tree(&result_obj._M_t);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&doc_keys._M_t);
        }
      }
      else {
        if (t != VARR) {
LAB_005a50d6:
          goto LAB_005a4ebb;
        }
        local_b0 = local_a0;
        local_a8 = 0;
        local_a0[0] = 0;
        str._M_string_length = in_stack_fffffffffffffc00;
        str._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbf8;
        str.field_2._M_allocated_capacity = in_stack_fffffffffffffc08;
        str.field_2._8_8_ = __return_storage_ptr__;
        UniValue::UniValue(&errors,VOBJ,str);
        std::__cxx11::string::~string((string *)&local_b0);
        uVar13 = 0;
        while (doc_keys._M_t._M_impl._0_8_ = uVar13, pUVar5 = UniValue::get_array(result),
              uVar13 < (ulong)(((long)(pUVar5->values).
                                      super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)(pUVar5->values).
                                     super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                                     .super__Vector_impl_data._M_start) / 0x58)) {
          uVar6 = ((long)(this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x88 - 1;
          uVar13 = doc_keys._M_t._M_impl._0_8_;
          if (uVar6 <= (ulong)doc_keys._M_t._M_impl._0_8_) {
            uVar13 = uVar6;
          }
          pvVar7 = std::vector<RPCResult,_std::allocator<RPCResult>_>::at(&this->m_inner,uVar13);
          pUVar5 = UniValue::get_array(result);
          pUVar5 = UniValue::operator[](pUVar5,doc_keys._M_t._M_impl._0_8_);
          MatchesType(&match,pvVar7,pUVar5);
          bVar4 = UniValue::isTrue(&match);
          if (!bVar4) {
            tinyformat::format<unsigned_long>(&local_128,"%d",(unsigned_long *)&doc_keys);
            UniValue::UniValue(&local_180,&match);
            key._M_string_length = in_stack_fffffffffffffc00;
            key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbf8;
            key.field_2._M_allocated_capacity = in_stack_fffffffffffffc08;
            key.field_2._8_8_ = __return_storage_ptr__;
            auVar15 = in_stack_fffffffffffffc20._0_32_;
            val.val._M_dataplus._M_p = (pointer)auVar15._0_8_;
            val.val._M_string_length = auVar15._8_8_;
            val.val.field_2 =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )auVar15._16_16_;
            val.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data =
                 (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )in_stack_fffffffffffffc20._32_24_;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data =
                 (_Vector_base<UniValue,_std::allocator<UniValue>_>)
                 (_Vector_base<UniValue,_std::allocator<UniValue>_>)
                 in_stack_fffffffffffffc20._56_24_;
            val._0_8_ = in_stack_fffffffffffffc18;
            UniValue::pushKV(&errors,key,val);
            UniValue::~UniValue(&local_180);
            std::__cxx11::string::~string((string *)&local_128);
          }
          UniValue::~UniValue(&match);
          uVar13 = doc_keys._M_t._M_impl._0_8_ + 1;
        }
        if (errors.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            errors.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start) {
          match.typ._0_1_ = 1;
          UniValue::UniValue<bool,_bool,_true>(__return_storage_ptr__,(bool *)&match);
        }
        else {
LAB_005a547f:
          UniValue::UniValue(__return_storage_ptr__,&errors);
        }
      }
      UniValue::~UniValue(&errors);
      pUVar5 = __return_storage_ptr__;
    }
    else {
      pUVar5 = __return_storage_ptr__;
      match._0_8_ = uvTypeName(result->typ);
      doc_keys._M_t._M_impl._0_8_ = uvTypeName(t);
      tinyformat::format<char_const*,char_const*>
                ((string *)&errors,(tinyformat *)"returned type is %s, but declared as %s in doc",
                 (char *)&match,(char **)&doc_keys,in_R8);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&errors);
      std::__cxx11::string::~string((string *)&errors);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pUVar5;
  }
LAB_005a5780:
  __stack_chk_fail();
}

Assistant:

UniValue RPCResult::MatchesType(const UniValue& result) const
{
    if (m_skip_type_check) {
        return true;
    }

    const auto exp_type = ExpectedType(m_type);
    if (!exp_type) return true; // can be any type, so nothing to check

    if (*exp_type != result.getType()) {
        return strprintf("returned type is %s, but declared as %s in doc", uvTypeName(result.getType()), uvTypeName(*exp_type));
    }

    if (UniValue::VARR == result.getType()) {
        UniValue errors(UniValue::VOBJ);
        for (size_t i{0}; i < result.get_array().size(); ++i) {
            // If there are more results than documented, reuse the last doc_inner.
            const RPCResult& doc_inner{m_inner.at(std::min(m_inner.size() - 1, i))};
            UniValue match{doc_inner.MatchesType(result.get_array()[i])};
            if (!match.isTrue()) errors.pushKV(strprintf("%d", i), std::move(match));
        }
        if (errors.empty()) return true; // empty result array is valid
        return errors;
    }

    if (UniValue::VOBJ == result.getType()) {
        if (!m_inner.empty() && m_inner.at(0).m_type == Type::ELISION) return true;
        UniValue errors(UniValue::VOBJ);
        if (m_type == Type::OBJ_DYN) {
            const RPCResult& doc_inner{m_inner.at(0)}; // Assume all types are the same, randomly pick the first
            for (size_t i{0}; i < result.get_obj().size(); ++i) {
                UniValue match{doc_inner.MatchesType(result.get_obj()[i])};
                if (!match.isTrue()) errors.pushKV(result.getKeys()[i], std::move(match));
            }
            if (errors.empty()) return true; // empty result obj is valid
            return errors;
        }
        std::set<std::string> doc_keys;
        for (const auto& doc_entry : m_inner) {
            doc_keys.insert(doc_entry.m_key_name);
        }
        std::map<std::string, UniValue> result_obj;
        result.getObjMap(result_obj);
        for (const auto& result_entry : result_obj) {
            if (doc_keys.find(result_entry.first) == doc_keys.end()) {
                errors.pushKV(result_entry.first, "key returned that was not in doc");
            }
        }

        for (const auto& doc_entry : m_inner) {
            const auto result_it{result_obj.find(doc_entry.m_key_name)};
            if (result_it == result_obj.end()) {
                if (!doc_entry.m_optional) {
                    errors.pushKV(doc_entry.m_key_name, "key missing, despite not being optional in doc");
                }
                continue;
            }
            UniValue match{doc_entry.MatchesType(result_it->second)};
            if (!match.isTrue()) errors.pushKV(doc_entry.m_key_name, std::move(match));
        }
        if (errors.empty()) return true;
        return errors;
    }

    return true;
}